

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall CProficiencies::ListKnownProficiencies(CProficiencies *this,char_data *player)

{
  PC_DATA *pPVar1;
  pointer pcVar2;
  pointer pbVar3;
  char *pcVar4;
  CProficiencies *this_00;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  responseList;
  string profStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> response;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  CProficiencies *local_2b8;
  size_t *local_2b0;
  value_type local_2a8;
  char *local_288 [2];
  char *local_278;
  buffer<char> local_268;
  char local_248 [536];
  
  if (player == (char_data *)0x0) {
    fmt_00._M_str = "CProficiencies::ListKnownProficiencies: Player is null.";
    fmt_00._M_len = 0x37;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt_00);
    return;
  }
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 2;
  uVar5 = 0;
  local_2b0 = (size_t *)&PTR_grow_00457340;
  local_2b8 = this;
  do {
    if (-1 < this->profs[uVar5]) {
      pcVar4 = "";
      if (uVar5 <= ((long)prof_table.
                          super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)prof_table.
                          super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1U)
      {
        pcVar4 = *(char **)((long)&(prof_table.
                                    super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ppsn + lVar7 * 4);
      }
      pPVar1 = this->ch->pcdata;
      if (pPVar1 == (PC_DATA *)0x0) {
        this_00 = &prof_none;
      }
      else {
        this_00 = &pPVar1->profs;
      }
      local_288[0] = GetSkillLevelName(this_00,(int)uVar5);
      local_268.size_ = 0;
      local_268._vptr_buffer = (_func_int **)local_2b0;
      local_268.capacity_ = 500;
      fmt.size_ = 0x13;
      fmt.data_ = "You are {} at {}.\n\r";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_288;
      args.desc_ = 0xcc;
      local_278 = pcVar4;
      local_268.ptr_ = local_248;
      ::fmt::v9::detail::vformat_to<char>(&local_268,fmt,args,(locale_ref)0x0);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,local_268.ptr_,local_268.ptr_ + local_268.size_);
      if (local_268.ptr_ != local_248) {
        operator_delete(local_268.ptr_,local_268.capacity_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2d8,&local_2a8);
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        this = local_2b8;
      }
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 10;
  } while (uVar5 != 0x19);
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    send_to_char("You currently have no proficiencies.\n\r",player);
  }
  else {
    send_to_char("Your proficiencies are:\n\r",player);
    pbVar3 = local_2d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar6 = local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_268._vptr_buffer = (_func_int **)&local_268.size_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar2,pcVar2 + pbVar6->_M_string_length);
        send_to_char((char *)local_268._vptr_buffer,player);
        if (local_268._vptr_buffer != (_func_int **)&local_268.size_) {
          operator_delete(local_268._vptr_buffer,local_268.size_ + 1);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar3);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  return;
}

Assistant:

void CProficiencies::ListKnownProficiencies(char_data* player)
{
	if (player == nullptr)
	{
		RS.Logger.Debug("CProficiencies::ListKnownProficiencies: Player is null.");
		return;
	}

	std::vector<std::string> responseList;

	auto limit = std::size(profs);
	for (int i = 0; i < limit ; i++)
	{
		if(profs[i] < 0)
			continue;
		
		char* profName = ch->Profs()->GetProficiency(i).name;
		auto profStr = fmt::format("You are {} at {}.\n\r", ch->Profs()->GetSkillLevelName(i), profName);
		responseList.push_back(profStr);
	}

	if (responseList.empty())
	{
		send_to_char("You currently have no proficiencies.\n\r", player);
	}
	else
	{
		send_to_char("Your proficiencies are:\n\r", player);
		for (auto response : responseList)
		{
			send_to_char(response.c_str(), player);
		}
	}	
}